

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

void mg_sock_addr_to_str(socket_address *sa,char *buf,size_t len,int flags)

{
  size_t sVar1;
  ulong uVar2;
  
  if (len != 0 && buf != (char *)0x0) {
    *buf = '\0';
    if ((flags & 1U) != 0) {
      inet_ntop(2,(sa->sa).sa_data + 2,buf,(socklen_t)len);
    }
    if ((flags & 2U) != 0) {
      uVar2 = (ulong)(ushort)((sa->sin).sin_port << 8 | (sa->sin).sin_port >> 8);
      if ((flags & 1U) == 0) {
        snprintf(buf,len,"%d",uVar2);
        return;
      }
      sVar1 = strlen(buf);
      snprintf(buf + sVar1,len + ~sVar1,"%s:%d","",uVar2);
      return;
    }
  }
  return;
}

Assistant:

void mg_sock_addr_to_str(const union socket_address *sa, char *buf, size_t len,
                         int flags) {
    int is_v6;
    if (buf == NULL || len <= 0) return;
    buf[0] = '\0';
#if defined(MG_ENABLE_IPV6)
    is_v6 = sa->sa.sa_family == AF_INET6;
#else
    is_v6 = 0;
#endif
    if (flags & MG_SOCK_STRINGIFY_IP) {
#if defined(MG_ENABLE_IPV6)
                                                                                                                                const void *addr = NULL;
    char *start = buf;
    socklen_t capacity = len;
    if (!is_v6) {
      addr = &sa->sin.sin_addr;
    } else {
      addr = (void *) &sa->sin6.sin6_addr;
      if (flags & MG_SOCK_STRINGIFY_PORT) {
        *buf = '[';
        start++;
        capacity--;
      }
    }
    if (inet_ntop(sa->sa.sa_family, addr, start, capacity) == NULL) {
      *buf = '\0';
    }
#elif defined(_WIN32) || defined(MG_ESP8266)
                                                                                                                                /* Only Windoze Vista (and newer) have inet_ntop() */
    strncpy(buf, inet_ntoa(sa->sin.sin_addr), len);
#else
        inet_ntop(AF_INET, (void *) &sa->sin.sin_addr, buf, len);
#endif
    }
    if (flags & MG_SOCK_STRINGIFY_PORT) {
        int port = ntohs(sa->sin.sin_port);
        if (flags & MG_SOCK_STRINGIFY_IP) {
            snprintf(buf + strlen(buf), len - (strlen(buf) + 1), "%s:%d",
                     (is_v6 ? "]" : ""), port);
        } else {
            snprintf(buf, len, "%d", port);
        }
    }
}